

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree_node.h
# Opt level: O2

int __thiscall
data_structures::
RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>::
_init(RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
      *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_> local_50;
  
  this->_left = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                 *)0x0;
  this->_right = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                  *)0x0;
  this->_parent =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  WeightedGraphAdjSet<int,_int>::WeightedGraphAdjSet(&local_50.value);
  TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::operator=
            (&this->element,&local_50);
  WeightedGraphAdjSet<int,_int>::~WeightedGraphAdjSet(&local_50.value);
  this->node_count = 1;
  this->_is_left = false;
  this->_is_red = false;
  return extraout_EAX;
}

Assistant:

inline
    void RBTreeNode<T>::_init() {
        _left = nullptr;
        _right = nullptr;
        _parent = nullptr;
        element = T();
        node_count = 1;
        _is_left = false;
        _is_red = false;
    }